

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePaddingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  uint __val;
  uint uVar4;
  bool bVar5;
  undefined1 *puVar6;
  long *plVar7;
  undefined1 *puVar8;
  undefined8 *puVar9;
  uint uVar10;
  ulong *puVar11;
  size_type *psVar12;
  ulong uVar13;
  Result *_result;
  uint __len;
  string err;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar5 = Result::good(__return_storage_ptr__);
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar5) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Padding","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_70,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Padding","");
    validateRankCount(__return_storage_ptr__,layer,&local_f0,2,-1,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar5) {
      return __return_storage_ptr__;
    }
  }
  if (layer->_oneof_case_[0] == 200) {
    puVar8 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar8 = Specification::_PaddingLayerParams_default_instance_;
  }
  puVar6 = (undefined1 *)(((ActivationParams *)puVar8)->NonlinearityType_).linear_;
  if ((ActivationLinear *)puVar6 == (ActivationLinear *)0x0) {
    puVar6 = Specification::_BorderAmounts_default_instance_;
  }
  if (((((ActivationLinear *)puVar6)->_cached_size_).size_.super___atomic_base<int>._M_i &
      0xfffffffdU) == 0) {
    if (((PaddingLayerParams *)puVar8)->_oneof_case_[0] != 0) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_d0,"Padding layer ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0.field_2._8_8_ = plVar7[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar12;
      local_f0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_f0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
    goto LAB_00357d73;
  }
  std::operator+(&local_50,"Padding layer ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_80 = *puVar11;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar11;
    local_90 = (ulong *)*plVar7;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined1 *)(((ActivationParams *)puVar8)->NonlinearityType_).parametricsoftplus_;
  if ((ActivationParametricSoftplus *)puVar8 == (ActivationParametricSoftplus *)0x0) {
    puVar8 = Specification::_BorderAmounts_default_instance_;
  }
  uVar2 = *(uint *)&((ActivationParametricSoftplus *)puVar8)->beta_;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar13 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar10 = (uint)uVar13;
      if (uVar10 < 100) {
        __len = __len - 2;
        goto LAB_00357bcb;
      }
      if (uVar10 < 1000) {
        __len = __len - 1;
        goto LAB_00357bcb;
      }
      if (uVar10 < 10000) goto LAB_00357bcb;
      uVar13 = uVar13 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar10);
    __len = __len + 1;
  }
LAB_00357bcb:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_b0),__len,__val);
  uVar13 = 0xf;
  if (local_90 != &local_80) {
    uVar13 = local_80;
  }
  if (uVar13 < (ulong)(local_a8 + local_88)) {
    uVar13 = 0xf;
    if (local_b0 != local_a0) {
      uVar13 = local_a0[0];
    }
    if (uVar13 < (ulong)(local_a8 + local_88)) goto LAB_00357c3a;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_00357c3a:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar12 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_d0.field_2._M_allocated_capacity = *psVar12;
    local_d0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar12;
    local_d0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_d0._M_string_length = puVar9[1];
  *puVar9 = psVar12;
  puVar9[1] = 0;
  *(undefined1 *)psVar12 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_f0.field_2._M_allocated_capacity = *psVar12;
    local_f0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar12;
    local_f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f0);
LAB_00357d73:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePaddingLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Padding", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Padding", 2, -1, blobNameToRank));
    }

    const auto& params = layer.padding();
    if (!(params.paddingamounts().borderamounts_size() == 0
          || params.paddingamounts().borderamounts_size() == 2)) {
        std::string err = "Padding layer " + layer.name() + " specifies " + std::to_string(params.paddingamounts().borderamounts_size()) + " padding amounts but it must either specify 2 (for x and y axes), or 0 for the default values.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (params.PaddingType_case() == Specification::PaddingLayerParams::PaddingTypeCase::PADDINGTYPE_NOT_SET) {
        std::string err = "Padding layer " + layer.name() + " padding type is not set.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}